

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall agge::tests::RendererTests::RenderMultilinedRasterOffset(RendererTests *this)

{
  undefined8 uVar1;
  cell *pcVar2;
  bool bVar3;
  int iVar4;
  cell *pcVar5;
  long lVar6;
  cell *pcVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  span *psVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  scanline_cells sVar16;
  allocator local_299;
  scanline_mockup local_298;
  ulong local_270;
  span reference2 [2];
  LocationInfo local_248;
  mask<8UL> mask;
  string local_1f8;
  cell cells3 [2];
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [16];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  cell local_194;
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  cell local_164;
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  cell local_134;
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  cell local_104;
  span reference1 [7];
  scanline_cells cells [5];
  
  bVar15 = 0;
  local_298.excepted_y = -1000000;
  local_298.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_298.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_298.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_298._25_8_ = 0;
  local_298._current_y = 0x7fffffff;
  cells[0].second = &local_104;
  local_128._0_4_ = 0;
  local_128._4_4_ = 0;
  local_118 = 0;
  uStack_10c = 0;
  local_128._8_8_ = 0xb00000011;
  uStack_114 = 0xfffffffd;
  uStack_110 = 0xd;
  local_108 = 0xfffffff2;
  cells[1].second = &local_134;
  local_158._0_4_ = -1;
  local_158._4_4_ = 0;
  local_148 = 0;
  uStack_13c = 0;
  local_158._8_8_ = 0x7000000aa;
  uStack_144 = 0xfffffffd;
  uStack_140 = 0x11;
  local_138 = 0xffffff59;
  cells[2].second = (cell *)local_1c0;
  cells3[1].area = 0;
  cells3[1].cover = -0x75;
  cells3[0].x = 0;
  cells3[0].area = 0;
  cells3[0].cover = 0x75;
  cells3[1].x = 0xd;
  cells[3].second = &local_164;
  local_178 = 0;
  uStack_16c = 0;
  local_188._0_4_ = 2;
  local_188._4_4_ = 0;
  local_188._8_8_ = 0x3000000ff;
  uStack_174 = 0xffffff9c;
  uStack_170 = 5;
  local_168 = 0xffffff65;
  cells[4].second = &local_194;
  local_1a8 = 0;
  uStack_19c = 0;
  local_1b8._0_4_ = 5;
  local_1b8._4_4_ = 0;
  local_1b8._8_8_ = 0x800000065;
  uStack_1a4 = 0xfffffffd;
  uStack_1a0 = 0xd;
  local_198 = 0xffffff9e;
  cells[0].first = (cell *)local_128;
  cells[1].first = (cell *)local_158;
  cells[2].first = cells3;
  cells[3].first = (cell *)local_188;
  cells[4].first = (cell *)local_1b8;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,5>
            ((mask<8ul> *)&mask,&cells,0x514);
  iVar12 = mask._height + mask._min_y;
  iVar9 = mask._min_y;
  do {
    do {
      iVar9 = iVar9 + 1;
      if (iVar12 <= iVar9) {
        puVar10 = &DAT_001a88b0;
        psVar11 = reference1;
        for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
          uVar1 = *puVar10;
          psVar11->y = (int)uVar1;
          psVar11->x = (int)((ulong)uVar1 >> 0x20);
          puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
          psVar11 = (span *)&psVar11[-(ulong)bVar15].length;
        }
        std::__cxx11::string::string
                  ((string *)reference2,
                   "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                   ,(allocator *)&local_1f8);
        ut::LocationInfo::LocationInfo(&local_248,(string *)reference2,0x228);
        ut::
        are_equal<agge::tests::(anonymous_namespace)::span,7ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                  (&reference1,&local_298.spans_log,&local_248);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        local_298.spans_log.
        super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
             SUB81(local_298.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start,0);
        local_298.spans_log.
        super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
             (undefined7)
             ((ulong)local_298.spans_log.
                     super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 8);
        iVar9 = mask._min_y + 3;
        uVar14 = (ulong)(uint)(mask._min_y + mask._height);
        local_270 = uVar14;
        do {
          if ((int)uVar14 <= iVar9) {
            reference2[1].y = 0x517;
            reference2[1].x = 3;
            reference2[1].length = 2;
            reference2[1].cover = 0x13600;
            reference2[0].y = 0x517;
            reference2[0].x = 2;
            reference2[0].length = 1;
            reference2[0].cover = 0x1fe00;
            std::__cxx11::string::string
                      ((string *)&local_1f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                       ,&local_299);
            ut::LocationInfo::LocationInfo(&local_248,&local_1f8,0x235);
            ut::
            are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                      (&reference2,&local_298.spans_log,&local_248);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::
            _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
            ::~_Vector_base(&mask._cells.
                             super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                           );
            anon_unknown_1::scanline_mockup::~scanline_mockup(&local_298);
            return;
          }
          sVar16 = mocks::mask<8UL>::operator[](&mask,iVar9);
          pcVar7 = sVar16.second;
          pcVar5 = sVar16.first;
          bVar3 = anon_unknown_1::scanline_mockup::begin(&local_298,iVar9);
          if (bVar3) {
            if (pcVar5 != pcVar7) {
              uVar13 = 0;
LAB_0018158a:
              iVar12 = pcVar5->x;
              iVar8 = 0;
              pcVar2 = pcVar5;
              do {
                pcVar5 = pcVar2 + 1;
                iVar8 = iVar8 + pcVar2->area;
                uVar13 = uVar13 + pcVar2->cover;
                if (pcVar5 == pcVar7) break;
                pcVar2 = pcVar5;
              } while (pcVar5->x == iVar12);
              if (iVar8 != 0) {
                anon_unknown_1::scanline_mockup::add_cell(&local_298,iVar12,uVar13 * 0x200 - iVar8);
                iVar12 = iVar12 + 1;
              }
              if (pcVar5 != pcVar7) {
                iVar8 = pcVar5->x - iVar12;
                if ((uVar13 & 0x7fffff) != 0 && iVar8 != 0) {
                  anon_unknown_1::scanline_mockup::add_span(&local_298,iVar12,iVar8,uVar13 * 0x200);
                }
                goto LAB_0018158a;
              }
            }
            anon_unknown_1::scanline_mockup::commit(&local_298);
            uVar14 = local_270;
          }
          iVar9 = iVar9 + 2;
        } while( true );
      }
      sVar16 = mocks::mask<8UL>::operator[](&mask,iVar9);
      pcVar7 = sVar16.second;
      pcVar5 = sVar16.first;
      bVar3 = anon_unknown_1::scanline_mockup::begin(&local_298,iVar9);
    } while (!bVar3);
    if (pcVar5 != pcVar7) {
      uVar13 = 0;
LAB_00181434:
      iVar8 = pcVar5->x;
      iVar4 = 0;
      pcVar2 = pcVar5;
      do {
        pcVar5 = pcVar2 + 1;
        iVar4 = iVar4 + pcVar2->area;
        uVar13 = uVar13 + pcVar2->cover;
        if (pcVar5 == pcVar7) break;
        pcVar2 = pcVar5;
      } while (pcVar5->x == iVar8);
      if (iVar4 != 0) {
        anon_unknown_1::scanline_mockup::add_cell(&local_298,iVar8,uVar13 * 0x200 - iVar4);
        iVar8 = iVar8 + 1;
      }
      if (pcVar5 != pcVar7) {
        iVar4 = pcVar5->x - iVar8;
        if ((uVar13 & 0x7fffff) != 0 && iVar4 != 0) {
          anon_unknown_1::scanline_mockup::add_span(&local_298,iVar8,iVar4,uVar13 * 0x200);
        }
        goto LAB_00181434;
      }
    }
    anon_unknown_1::scanline_mockup::commit(&local_298);
  } while( true );
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}